

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O3

void __thiscall Tree::BuildVirtualFolderImpl(Tree *this,string *virtualFolders,string *prefix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pTVar2;
  long *plVar3;
  size_type *psVar4;
  pointer this_00;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_60 = virtualFolders;
  local_58 = prefix;
  std::operator+(&local_50,"CMake Files\\",prefix);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_50,(ulong)(this->path)._M_dataplus._M_p);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_80.field_2._M_allocated_capacity = *psVar4;
    local_80.field_2._8_8_ = plVar3[3];
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar4;
    local_80._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_80._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
  paVar1 = &local_a0.field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_a0.field_2._M_allocated_capacity = *psVar4;
    local_a0.field_2._8_8_ = plVar3[3];
    local_a0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar4;
    local_a0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_a0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_60,(ulong)local_a0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this_00 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
            super__Vector_impl_data._M_start;
  pTVar2 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_00 != pTVar2) {
    do {
      std::operator+(&local_80,local_58,&this->path);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_a0.field_2._M_allocated_capacity = *psVar4;
        local_a0.field_2._8_8_ = plVar3[3];
        local_a0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar4;
        local_a0._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_a0._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      BuildVirtualFolderImpl(this_00,local_60,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pTVar2);
  }
  return;
}

Assistant:

void Tree::BuildVirtualFolderImpl(std::string& virtualFolders,
                                  const std::string& prefix) const
{
  virtualFolders += "CMake Files\\" + prefix + this->path + "\\;";
  for (Tree const& folder : this->folders) {
    folder.BuildVirtualFolderImpl(virtualFolders, prefix + this->path + "\\");
  }
}